

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::BindingImageInvalidTest::prepareNextTestCase
          (BindingImageInvalidTest *this,GLuint test_case_index)

{
  uint uVar1;
  
  uVar1 = test_case_index + 1;
  if (uVar1 < 5) {
    this->m_case = *(TESTCASES *)(&DAT_016cbb20 + (ulong)uVar1 * 4);
  }
  return uVar1 < 5;
}

Assistant:

bool BindingImageInvalidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
		m_case = TEST_CASES_MAX;
		break;
	case NEGATIVE_VALUE:
	case VARIABLE_NAME:
	case STD140:
	case MISSING:
		m_case = (TESTCASES)test_case_index;
		break;
	default:
		return false;
	}

	return true;
}